

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

void feat_copy(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = fcb->window_size;
  if (-1 < (long)iVar1) {
    lVar6 = -(long)iVar1;
    uVar3 = (ulong)(uint)fcb->n_stream;
    do {
      if (0 < (int)uVar3) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          uVar3 = (ulong)fcb->stream_len[lVar5] / (ulong)(iVar1 * 2 + 1);
          iVar2 = (int)uVar3;
          memcpy(feat[lVar5] + (uint)(iVar2 * (iVar1 + (int)lVar6)),mfc[lVar6] + uVar4,uVar3 * 4);
          lVar5 = lVar5 + 1;
          uVar3 = (ulong)fcb->n_stream;
          uVar4 = (ulong)(uint)(iVar2 + (int)uVar4);
        } while (lVar5 < (long)uVar3);
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 + 1 != (int)lVar6);
  }
  return;
}

Assistant:

static void
feat_copy(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    int32 win, i, j;

    win = feat_window_size(fcb);

    /* Concatenate input features */
    for (i = -win; i <= win; ++i) {
        uint32 spos = 0;

        for (j = 0; j < feat_n_stream(fcb); ++j) {
            uint32 stream_len;

            /* Unscale the stream length by the window. */
            stream_len = feat_stream_len(fcb, j) / (2 * win + 1);
            memcpy(feat[j] + ((i + win) * stream_len),
                   mfc[i] + spos,
                   stream_len * sizeof(mfcc_t));
            spos += stream_len;
        }
    }
}